

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

QJsonObject __thiscall QPluginParsedMetaData::toJson(QPluginParsedMetaData *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QJsonValueConstRef QVar4;
  QCborMap *__range1;
  QJsonObject *o;
  char16_t *str_3;
  char16_t *str;
  char16_t *str_5;
  char16_t *str_1;
  char16_t *str_2;
  char16_t *str_4;
  char16_t *str_6;
  QString key;
  value_type it;
  iterator __end1;
  iterator __begin1;
  DataPointer *in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 in_stack_fffffffffffffca8;
  anon_union_8_3_4e90986c_for_QJsonValueConstRef_0 value;
  QString *in_stack_fffffffffffffcb0;
  QCborValueConstRef *in_stack_fffffffffffffcb8;
  QCborValueConstRef *in_stack_fffffffffffffcc0;
  undefined6 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcce;
  undefined1 in_stack_fffffffffffffccf;
  QString local_208 [2];
  QArrayDataPointer<char16_t> local_1d8 [2];
  QArrayDataPointer<char16_t> local_1a8 [2];
  QArrayDataPointer<char16_t> local_178 [2];
  QArrayDataPointer<char16_t> local_148 [2];
  QArrayDataPointer<char16_t> local_118 [2];
  QArrayDataPointer<char16_t> local_e8 [2];
  QArrayDataPointer<char16_t> local_b8 [2];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QCborValueConstRef local_48;
  QCborValueConstRef local_38 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)0x4425f5);
  ::QCborValue::toMap((QCborValue *)
                      CONCAT17(in_stack_fffffffffffffccf,
                               CONCAT16(in_stack_fffffffffffffcce,in_stack_fffffffffffffcc8)));
  local_38[0].d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_38[0].i = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38[0] = (QCborValueConstRef)QCborMap::begin((QCborMap *)in_stack_fffffffffffffca8.a);
  local_48.d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QCborValueConstRef)QCborMap::end((QCborMap *)in_stack_fffffffffffffcb8);
  QVar4._8_8_ = in_stack_fffffffffffffca0;
  QVar4.field_0.a = in_stack_fffffffffffffca8.a;
  while( true ) {
    uVar1 = ::operator!=(QVar4._8_8_,(Iterator *)in_stack_fffffffffffffc98);
    if (!(bool)uVar1) break;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QCborMap::Iterator::operator*((Iterator *)in_stack_fffffffffffffcb8);
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x44277e);
    uVar2 = QCborValueConstRef::isInteger((QCborValueConstRef *)0x44278b);
    if ((bool)uVar2) {
      in_stack_fffffffffffffcb8 =
           (QCborValueConstRef *)
           QCborValueConstRef::toInteger
                     (in_stack_fffffffffffffcc0,(qint64)in_stack_fffffffffffffcb8);
      in_stack_fffffffffffffcc0 = in_stack_fffffffffffffcb8;
      switch(in_stack_fffffffffffffcb8) {
      case (QCborValueConstRef *)0x0:
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_178,(Data *)0x0,L"version",7);
        QString::QString(QVar4._8_8_,in_stack_fffffffffffffc98);
        QString::operator=(QVar4._8_8_,(QString *)in_stack_fffffffffffffc98);
        QString::~QString((QString *)0x442b8e);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(QVar4._8_8_);
        break;
      case (QCborValueConstRef *)0x1:
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_1a8,(Data *)0x0,L"archlevel",9);
        QString::QString(QVar4._8_8_,in_stack_fffffffffffffc98);
        QString::operator=(QVar4._8_8_,(QString *)in_stack_fffffffffffffc98);
        QString::~QString((QString *)0x442c50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(QVar4._8_8_);
        break;
      case (QCborValueConstRef *)0x2:
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_b8,(Data *)0x0,L"IID",3);
        QString::QString(QVar4._8_8_,in_stack_fffffffffffffc98);
        QString::operator=(QVar4._8_8_,(QString *)in_stack_fffffffffffffc98);
        QString::~QString((QString *)0x442886);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(QVar4._8_8_);
        break;
      case (QCborValueConstRef *)0x3:
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_e8,(Data *)0x0,L"className",9);
        QString::QString(QVar4._8_8_,in_stack_fffffffffffffc98);
        QString::operator=(QVar4._8_8_,(QString *)in_stack_fffffffffffffc98);
        QString::~QString((QString *)0x442948);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(QVar4._8_8_);
        break;
      case (QCborValueConstRef *)0x4:
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_118,(Data *)0x0,L"MetaData",8);
        QString::QString(QVar4._8_8_,in_stack_fffffffffffffc98);
        QString::operator=(QVar4._8_8_,(QString *)in_stack_fffffffffffffc98);
        QString::~QString((QString *)0x442a0a);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(QVar4._8_8_);
        break;
      case (QCborValueConstRef *)0x5:
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_148,(Data *)0x0,L"URI",3);
        QString::QString(QVar4._8_8_,in_stack_fffffffffffffc98);
        QString::operator=(QVar4._8_8_,(QString *)in_stack_fffffffffffffc98);
        QString::~QString((QString *)0x442acc);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(QVar4._8_8_);
        break;
      case (QCborValueConstRef *)0x6:
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_1d8,(Data *)0x0,L"debug",5);
        QString::QString(QVar4._8_8_,in_stack_fffffffffffffc98);
        QString::operator=(QVar4._8_8_,(QString *)in_stack_fffffffffffffc98);
        QString::~QString((QString *)0x442d12);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(QVar4._8_8_);
      }
    }
    else {
      in_stack_fffffffffffffcb0 = local_208;
      QString::QString((QString *)0x442d62);
      QCborValueConstRef::toString
                ((QCborValueConstRef *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffcc8)),
                 (QString *)in_stack_fffffffffffffcc0);
      QString::operator=(QVar4._8_8_,(QString *)in_stack_fffffffffffffc98);
      QString::~QString((QString *)0x442da0);
      QString::~QString((QString *)0x442dad);
    }
    bVar3 = QString::isEmpty((QString *)0x442de6);
    value = QVar4.field_0;
    if (!bVar3) {
      QCborValueRef::toJsonValue((QCborValueRef *)in_stack_fffffffffffffc98);
      QVar4 = (QJsonValueConstRef)
              QJsonObject::insert((QJsonObject *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0
                                  ,(QJsonValue *)value.a);
      QJsonValue::~QJsonValue((QJsonValue *)0x442e4f);
    }
    QString::~QString((QString *)0x442e85);
    QCborMap::Iterator::operator++((Iterator *)local_38);
  }
  QCborMap::~QCborMap((QCborMap *)0x4426dc);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject QPluginParsedMetaData::toJson() const
{
    // convert from the internal CBOR representation to an external JSON one
    QJsonObject o;
    for (auto it : data.toMap()) {
        QString key;
        if (it.first.isInteger()) {
            switch (it.first.toInteger()) {
#define CONVERT_TO_STRING(IntKey, StringKey, Description) \
            case int(IntKey): key = QStringLiteral(StringKey); break;
                QT_PLUGIN_FOREACH_METADATA(CONVERT_TO_STRING)
            }
        } else {
            key = it.first.toString();
        }

        if (!key.isEmpty())
            o.insert(key, it.second.toJsonValue());
    }
    return o;
}